

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  String *pSVar6;
  char *pcVar7;
  unsigned_long *puVar8;
  char (*extraout_RDX) [3];
  char (*extraout_RDX_00) [3];
  char (*params) [3];
  ArrayPtr<const_char> AVar9;
  Range<unsigned_long> RVar10;
  ArrayPtr<const_char> part;
  ArrayPtr<const_kj::String> *local_148;
  Fault local_128;
  Fault f_4;
  size_t i_1;
  Iterator __end1_2;
  Iterator __begin1_2;
  Range<unsigned_long> *__range1_2;
  Fault f_3;
  ulong local_e0;
  size_t i;
  Fault f_2;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  ArrayPtr<const_kj::String> *__range1_1;
  char *pcStack_98;
  bool leadingSlash;
  char *ptr;
  String *p;
  String *__end1;
  String *__begin1;
  ArrayPtr<const_kj::String> *__range1;
  size_t size;
  Fault f_1;
  Path *local_48;
  bool isUncPath;
  Fault local_28;
  Fault f;
  bool forApi_local;
  bool absolute_local;
  PathPtr *this_local;
  String *result;
  
  f.exception._6_1_ = forApi;
  f.exception._7_1_ = absolute;
  sVar5 = ArrayPtr<const_kj::String>::size(&this->parts);
  if (sVar5 == 0) {
    params = extraout_RDX;
    if (((f.exception._7_1_ ^ 0xff) & 1) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0xc4,FAILED,"!absolute","\"absolute path is missing disk designator\"",
                 (char (*) [41])"absolute path is missing disk designator");
      _::Debug::Fault::~Fault(&local_28);
      params = extraout_RDX_00;
    }
    if ((f.exception._7_1_ & 1) == 0) {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x42f6b4,(char (*) [2])params);
    }
    else {
      str<char_const(&)[3]>(__return_storage_ptr__,(kj *)"\\\\",params);
    }
  }
  else {
    bVar2 = false;
    if ((f.exception._7_1_ & 1) == 0) {
      f.exception._6_1_ = 0;
    }
    else {
      pSVar6 = ArrayPtr<const_kj::String>::operator[](&this->parts,0);
      AVar9 = String::operator_cast_to_ArrayPtr(pSVar6);
      local_48 = (Path *)AVar9.ptr;
      AVar9.ptr = AVar9.size_;
      bVar1 = Path::isWin32Drive(local_48,AVar9);
      if (!bVar1) {
        pSVar6 = ArrayPtr<const_kj::String>::operator[](&this->parts,0);
        _f_1 = String::operator_cast_to_ArrayPtr(pSVar6);
        part.size_ = (char *)f_1._8_8_;
        part.ptr = part.size_;
        bVar2 = Path::isNetbiosName((Path *)f_1.exception,part);
        if (!bVar2) {
          pSVar6 = ArrayPtr<const_kj::String>::operator[](&this->parts,0);
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                    ((Fault *)&size,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0xd2,FAILED,(char *)0x0,
                     "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                     ,(char (*) [70])
                      "absolute win32 path must start with drive letter or netbios host name",pSVar6
                    );
          _::Debug::Fault::fatal((Fault *)&size);
        }
        bVar2 = true;
      }
    }
    if ((f.exception._6_1_ & 1) == 0) {
      iVar4 = 0;
      if (bVar2) {
        iVar4 = 2;
      }
      sVar5 = ArrayPtr<const_kj::String>::size(&this->parts);
      local_148 = (ArrayPtr<const_kj::String> *)((long)iVar4 + (sVar5 - 1));
    }
    else {
      iVar4 = 4;
      if (bVar2) {
        iVar4 = 8;
      }
      sVar5 = ArrayPtr<const_kj::String>::size(&this->parts);
      local_148 = (ArrayPtr<const_kj::String> *)((long)iVar4 + (sVar5 - 1));
    }
    __range1 = local_148;
    __end1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    pSVar6 = ArrayPtr<const_kj::String>::end(&this->parts);
    for (; __end1 != pSVar6; __end1 = __end1 + 1) {
      sVar5 = String::size(__end1);
      __range1 = (ArrayPtr<const_kj::String> *)((long)&__range1->ptr + sVar5);
    }
    bVar1 = false;
    heapString(__return_storage_ptr__,(size_t)__range1);
    pcVar7 = String::begin(__return_storage_ptr__);
    if ((f.exception._6_1_ & 1) == 0) {
      pcStack_98 = pcVar7;
      if (bVar2) {
        *pcVar7 = '\\';
        pcStack_98 = pcVar7 + 2;
        pcVar7[1] = '\\';
      }
    }
    else {
      builtin_strncpy(pcVar7,"\\\\?\\",4);
      pcStack_98 = pcVar7 + 4;
      if (bVar2) {
        builtin_strncpy(pcVar7 + 4,"UNC\\",4);
        pcStack_98 = pcVar7 + 8;
      }
    }
    bVar2 = false;
    __end1_1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    pSVar6 = ArrayPtr<const_kj::String>::end(&this->parts);
    for (; __end1_1 != pSVar6; __end1_1 = __end1_1 + 1) {
      if (bVar2) {
        *pcStack_98 = '\\';
        pcStack_98 = pcStack_98 + 1;
      }
      bVar2 = true;
      StringPtr::StringPtr((StringPtr *)&f_2,__end1_1);
      bVar3 = Path::isWin32Special((StringPtr)_f_2);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::String_const&>
                  ((Fault *)&i,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xf9,FAILED,"!Path::isWin32Special(p)",
                   "\"path cannot contain DOS reserved name\", p",
                   (char (*) [38])"path cannot contain DOS reserved name",__end1_1);
        for (local_e0 = 0; sVar5 = String::size(__end1_1), local_e0 < sVar5; local_e0 = local_e0 + 1
            ) {
          *pcStack_98 = '|';
          pcStack_98 = pcStack_98 + 1;
        }
        f_3.exception._4_4_ = 0x12;
        _::Debug::Fault::~Fault((Fault *)&i);
        if (f_3.exception._4_4_ != 0x12) goto LAB_003e6e7e;
      }
      else {
        pcVar7 = String::begin(__end1_1);
        sVar5 = String::size(__end1_1);
        memcpy(pcStack_98,pcVar7,sVar5);
        sVar5 = String::size(__end1_1);
        pcStack_98 = pcStack_98 + sVar5;
      }
    }
    pcVar7 = String::end(__return_storage_ptr__);
    if (pcStack_98 != pcVar7) {
      _::Debug::Fault::Fault
                ((Fault *)&__range1_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x106,FAILED,"ptr == result.end()","");
      _::Debug::Fault::fatal((Fault *)&__range1_2);
    }
    RVar10 = indices<kj::String&>(__return_storage_ptr__);
    __begin1_2.value = RVar10.begin_;
    __end1_2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1_2);
    i_1 = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1_2);
    while (bVar2 = Range<unsigned_long>::Iterator::operator!=(&__end1_2,(Iterator *)&i_1), bVar2) {
      puVar8 = Range<unsigned_long>::Iterator::operator*(&__end1_2);
      f_4.exception = (Exception *)*puVar8;
      pcVar7 = String::operator[](__return_storage_ptr__,(size_t)f_4.exception);
      if (*pcVar7 == ':') {
        if ((f.exception._7_1_ & 1) != 0) {
          iVar4 = 1;
          if ((f.exception._6_1_ & 1) != 0) {
            iVar4 = 5;
          }
          if (f_4.exception == (Exception *)(long)iVar4) goto LAB_003e6e58;
        }
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                  (&local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x113,FAILED,(char *)0x0,
                   "\"colons are prohibited in win32 paths to avoid triggering alterante data streams\", result"
                   ,(char (*) [80])
                    "colons are prohibited in win32 paths to avoid triggering alterante data streams"
                   ,__return_storage_ptr__);
        pcVar7 = String::operator[](__return_storage_ptr__,(size_t)f_4.exception);
        *pcVar7 = '|';
        f_3.exception._4_4_ = 0x18;
        _::Debug::Fault::~Fault(&local_128);
      }
LAB_003e6e58:
      Range<unsigned_long>::Iterator::operator++(&__end1_2);
    }
    bVar1 = true;
    f_3.exception._4_4_ = 1;
LAB_003e6e7e:
    if (!bVar1) {
      String::~String(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alterante data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}